

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O3

sexp_conflict sexp_heap_walk(sexp_conflict ctx,int depth,int printp)

{
  sexp_conflict psVar1;
  sexp psVar2;
  sexp psVar3;
  long lVar4;
  uint uVar5;
  undefined8 uVar6;
  sexp_conflict psVar7;
  sexp_conflict psVar8;
  ulong uVar9;
  sexp_conflict x;
  sexp_conflict psVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  sexp_heap_conflict psVar14;
  sexp_conflict stats_res;
  sexp_conflict tmp;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  size_t freed;
  sexp_uint_t sizes [256];
  sexp_uint_t stats [256];
  sexp_conflict local_10b0;
  sexp_conflict local_10a8;
  sexp_conflict local_10a0;
  int local_1094;
  sexp_conflict local_1090;
  sexp_gc_var_t local_1088;
  sexp_gc_var_t local_1078;
  sexp_gc_var_t local_1068;
  sexp_gc_var_t local_1058 [2];
  long local_1038 [255];
  long lStack_840;
  long local_838 [257];
  
  psVar14 = (ctx->value).context.heap;
  local_10a8 = (sexp_conflict)0x43e;
  local_1088.var = (sexp_conflict *)0x0;
  local_1088.next = (sexp_gc_var_t *)0x0;
  local_10b0 = (sexp_conflict)0x43e;
  local_1058[0].var = (sexp_conflict *)0x0;
  local_1058[0].next = (sexp_gc_var_t *)0x0;
  local_10a0 = (sexp_conflict)0x43e;
  local_1068.var = (sexp_conflict *)0x0;
  local_1068.next = (sexp_gc_var_t *)0x0;
  local_1090 = (sexp_conflict)0x43e;
  local_1078.var = (sexp_conflict *)0x0;
  local_1078.next = (sexp_gc_var_t *)0x0;
  local_1094 = depth;
  if (printp == 0) {
    psVar7 = (sexp_conflict)0x3e;
  }
  else {
    uVar6 = sexp_env_ref(ctx,(ctx->value).type.cpl,
                         (((ctx->value).type.setters)->value).context.mark_stack[3].end,0x3e);
    psVar7 = (sexp_conflict)sexp_parameter_ref(ctx,uVar6);
  }
  sexp_gc(ctx);
  uVar12 = 0;
  memset(local_838,0,0x800);
  memset(local_1038,0,0x800);
  if (psVar14 != (sexp_heap_conflict)0x0) {
    uVar12 = 0;
    do {
      if (0x20 < (long)psVar14->size) {
        psVar10 = (sexp_conflict)(psVar14->data + psVar14->size);
        x = (sexp_conflict)(psVar14->data + 0x20);
        psVar1 = (sexp_conflict)psVar14->free_list;
LAB_00101576:
        do {
          psVar8 = psVar1;
          psVar1 = (psVar8->value).type.name;
          if (psVar1 != (sexp_conflict)0x0) {
            if (psVar1 < x) goto LAB_00101576;
          }
          if (psVar1 == x) {
            x = (sexp_conflict)((long)&x->tag + *(long *)psVar1);
            psVar1 = psVar8;
            if (psVar10 <= x) break;
            goto LAB_00101576;
          }
          if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0x11)) {
            sexp_print_simple(ctx,x,psVar7,local_1094);
            psVar2 = (psVar7->value).type.setters;
            if (psVar2 == (sexp)0x0) {
              putc(10,(FILE *)(psVar7->value).type.getters);
            }
            else {
              psVar3 = (psVar7->value).type.print;
              if (psVar3 < (sexp)(psVar7->value).port.size) {
                (psVar7->value).type.print = (sexp)((long)&psVar3->tag + 1);
                *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 10;
              }
              else {
                sexp_buffered_write_char(ctx,10);
              }
            }
          }
          uVar5 = x->tag;
          if (0xfe < x->tag) {
            uVar5 = 0xff;
          }
          local_838[uVar5] = local_838[uVar5] + 1;
          lVar13 = sexp_allocated_bytes(ctx,x);
          uVar9 = lVar13 + 0x1f;
          uVar11 = uVar9 >> 5;
          if (0x1fff < uVar9) {
            uVar11 = 0xff;
          }
          local_1038[uVar11] = local_1038[uVar11] + 1;
          if (uVar12 <= x->tag) {
            uVar12 = (ulong)x->tag;
          }
          x = (sexp_conflict)((long)&x->tag + (uVar9 & 0xffffffffffffffe0));
          psVar1 = psVar8;
        } while (x < psVar10);
      }
      psVar14 = psVar14->next;
    } while (psVar14 != (sexp_heap)0x0);
  }
  local_1088.var = &local_10a8;
  local_1058[0].next = &local_1088;
  local_1088.next = (ctx->value).context.saves;
  local_1058[0].var = &local_10b0;
  local_1068.next = local_1058;
  local_1068.var = &local_10a0;
  local_1078.next = &local_1068;
  local_1078.var = &local_1090;
  (ctx->value).context.saves = &local_1078;
  local_10a8 = (sexp_conflict)0x23e;
  if (uVar12 != 0) {
    lVar13 = uVar12 + 1;
    do {
      lVar4 = (&lStack_840)[lVar13];
      if (lVar4 != 0) {
        local_1090 = (sexp_conflict)
                     sexp_string_to_symbol_op
                               (ctx,0,1,*(undefined8 *)
                                         (*(long *)((long)&((((ctx->value).type.setters)->value).
                                                            type.getters)->value + lVar13 * 8) + 8))
        ;
        local_10a0 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_1090,lVar4 * 2 + 1);
        local_10a8 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_10a0,local_10a8);
      }
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  local_10b0 = (sexp_conflict)0x23e;
  psVar7 = (sexp_conflict)0x23e;
  lVar13 = 0x1fe;
  do {
    lVar4 = *(long *)((long)local_1038 + lVar13 * 4);
    if (lVar4 != 0) {
      local_10a0 = (sexp_conflict)sexp_cons_op(ctx,0,2,lVar13 + 1,lVar4 * 2 + 1);
      psVar7 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_10a0,local_10b0);
      local_10b0 = psVar7;
    }
    lVar13 = lVar13 + -2;
  } while (lVar13 != -2);
  psVar7 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_10a8,psVar7);
  (ctx->value).context.saves = local_1088.next;
  return psVar7;
}

Assistant:

static sexp sexp_heap_walk (sexp ctx, int depth, int printp) {
  size_t freed;
  sexp_uint_t stats[256], sizes[256], hi_type=0, size;
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, out=SEXP_FALSE;
  sexp_free_list q, r;
  char *end;
  sexp_gc_var4(stats_res, res, tmp, name);

  if (printp)
    out = sexp_parameter_ref(ctx,
                             sexp_env_ref(ctx,
                                          sexp_context_env(ctx),
                                          sexp_global(ctx,SEXP_G_CUR_OUT_SYMBOL),
                                          SEXP_FALSE));

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<256; i++) { stats[i]=0; sizes[i]=0; }

  /* loop over each heap chunk */
  for ( ; h; h=h->next) {
    p = (sexp) (h->data + sexp_heap_align(sexp_sizeof(pair)));
    q = h->free_list;
    end = (char*)h->data + h->size;
    while (((char*)p) < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      /* otherwise maybe print, then increment the stat and continue */
      if (sexp_oportp(out)) {
        sexp_print_simple(ctx, p, out, depth);
        sexp_write_char(ctx, '\n', out);
      }
      stats[sexp_pointer_tag(p) > 255 ? 255 : sexp_pointer_tag(p)]++;
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
      sizes[sexp_heap_chunks(size) > 255 ? 255 : sexp_heap_chunks(size)]++;
      if (sexp_pointer_tag(p) > hi_type)
        hi_type = sexp_pointer_tag(p);
      p = (sexp) (((char*)p) + size);
    }
  }

  /* build and return results */
  sexp_gc_preserve4(ctx, stats_res, res, tmp, name);
  stats_res = SEXP_NULL;
  for (i=hi_type; i>0; i--)
    if (stats[i]) {
      name = sexp_string_to_symbol(ctx, sexp_type_name_by_index(ctx, i));
      tmp = sexp_cons(ctx, name, sexp_make_fixnum(stats[i]));
      stats_res = sexp_cons(ctx, tmp, stats_res);
    }
  res = SEXP_NULL;
  for (i=255; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  res = sexp_cons(ctx, stats_res, res);
  sexp_gc_release4(ctx);
  return res;
}